

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall qpdf::Tokenizer::inNumber(Tokenizer *this,char ch)

{
  bool bVar1;
  char ch_local;
  Tokenizer *this_local;
  
  bVar1 = util::is_digit(ch);
  if (!bVar1) {
    if (ch == '.') {
      this->state = st_real;
    }
    else {
      bVar1 = isDelimiter(this,ch);
      if (bVar1) {
        this->type = tt_integer;
        this->state = st_token_ready;
        this->in_token = false;
        this->char_to_unread = ch;
      }
      else {
        this->state = st_literal;
      }
    }
  }
  return;
}

Assistant:

void
Tokenizer::inNumber(char ch)
{
    if (util::is_digit(ch)) {
    } else if (ch == '.') {
        state = st_real;
    } else if (isDelimiter(ch)) {
        type = tt::tt_integer;
        state = st_token_ready;
        in_token = false;
        char_to_unread = ch;
    } else {
        state = st_literal;
    }
}